

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void Unserialize<ParamsStream<AutoFile&,TransactionSerParams>,28u,unsigned_char>
               (ParamsStream<AutoFile_&,_TransactionSerParams> *is,
               prevector<28U,_unsigned_char,_unsigned_int,_int> *v)

{
  long lVar1;
  uint64_t uVar2;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar3;
  size_t in_RCX;
  uint uVar4;
  uint uVar5;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::clear(v);
  uVar2 = ReadCompactSize<ParamsStream<AutoFile&,TransactionSerParams>>(is,true);
  uVar5 = 0;
  while (uVar4 = (uint)uVar2 - uVar5, uVar5 <= (uint)uVar2 && uVar4 != 0) {
    if (4999999 < uVar4) {
      uVar4 = 5000000;
    }
    prevector<28U,_unsigned_char,_unsigned_int,_int>::resize_uninitialized(v,uVar4 + uVar5);
    ppVar3 = v;
    if (0x1c < v->_size) {
      ppVar3 = *(prevector<28U,_unsigned_char,_unsigned_int,_int> **)&v->_union;
    }
    ParamsStream<AutoFile_&,_TransactionSerParams>::read
              (is,uVar5 + (int)ppVar3,(void *)(ulong)uVar4,in_RCX);
    uVar5 = uVar4 + uVar5;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unserialize(Stream& is, prevector<N, T>& v)
{
    if constexpr (BasicByte<T>) { // Use optimized version for unformatted basic bytes
        // Limit size per read so bogus size value won't cause out of memory
        v.clear();
        unsigned int nSize = ReadCompactSize(is);
        unsigned int i = 0;
        while (i < nSize) {
            unsigned int blk = std::min(nSize - i, (unsigned int)(1 + 4999999 / sizeof(T)));
            v.resize_uninitialized(i + blk);
            is.read(AsWritableBytes(Span{&v[i], blk}));
            i += blk;
        }
    } else {
        Unserialize(is, Using<VectorFormatter<DefaultFormatter>>(v));
    }
}